

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

StateRecorderApplicationFeatureHash
Fossilize::Hashing::compute_application_feature_hash(VkApplicationInfo *info,void *device_pnext)

{
  StateRecorderApplicationFeatureHash SVar1;
  void *device_pnext_local;
  VkApplicationInfo *info_local;
  StateRecorderApplicationFeatureHash hash;
  
  info_local = (VkApplicationInfo *)0x0;
  hash.application_info_hash = 0;
  if (info != (VkApplicationInfo *)0x0) {
    info_local = (VkApplicationInfo *)compute_hash_application_info(info);
  }
  if (device_pnext != (void *)0x0) {
    hash.application_info_hash = compute_hash_physical_device_features(device_pnext);
  }
  SVar1.physical_device_features_hash = hash.application_info_hash;
  SVar1.application_info_hash = (Hash)info_local;
  return SVar1;
}

Assistant:

StateRecorderApplicationFeatureHash compute_application_feature_hash(const VkApplicationInfo *info,
                                                                     const void *device_pnext)
{
	StateRecorderApplicationFeatureHash hash = {};
	if (info)
		hash.application_info_hash = compute_hash_application_info(*info);
	if (device_pnext)
		hash.physical_device_features_hash = compute_hash_physical_device_features(device_pnext);
	return hash;
}